

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TasmanianSparseGrid.cpp
# Opt level: O0

void __thiscall
TasGrid::TasmanianSparseGrid::evaluateBatch(TasmanianSparseGrid *this,double *x,int num_x,double *y)

{
  pointer pBVar1;
  double *pdVar2;
  undefined1 local_50 [8];
  Data2D<double> x_tmp;
  double *y_local;
  int num_x_local;
  double *x_local;
  TasmanianSparseGrid *this_local;
  
  x_tmp.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = y;
  Data2D<double>::Data2D((Data2D<double> *)local_50);
  pBVar1 = ::std::
           unique_ptr<TasGrid::BaseCanonicalGrid,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
           ::operator->(&this->base);
  pdVar2 = formCanonicalPoints<double>(this,x,(Data2D<double> *)local_50,num_x);
  (*pBVar1->_vptr_BaseCanonicalGrid[0x13])
            (pBVar1,pdVar2,(ulong)(uint)num_x,
             x_tmp.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage);
  Data2D<double>::~Data2D((Data2D<double> *)local_50);
  return;
}

Assistant:

void TasmanianSparseGrid::evaluateBatch(const double x[], int num_x, double y[]) const{
    Data2D<double> x_tmp;
    base->evaluateBatch(formCanonicalPoints(x, x_tmp, num_x), num_x, y);
}